

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode Curl_req_soft_reset(SingleRequest *req,Curl_easy *data)

{
  CURLcode result;
  Curl_easy *data_local;
  SingleRequest *req_local;
  
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xfffffffd;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xfffffeff;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xfffffdff;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xfffffff7;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xffffffef;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xffffffdf;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xffffffbf;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xfffffbff;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xffefffff;
  req->bytecount = 0;
  req->writebytecount = 0;
  *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xfffffffe | 1;
  req->headerline = 0;
  req->headerbytecount = 0;
  req->allheadercount = 0;
  req->deductheadercount = 0;
  req_local._4_4_ = Curl_client_start(data);
  if (req_local._4_4_ == CURLE_OK) {
    if ((*(uint *)&req->field_0xd9 >> 0x13 & 1) == 0) {
      Curl_bufq_init2(&req->sendbuf,(ulong)(data->set).upload_buffer_size,1,1);
      *(uint *)&req->field_0xd9 = *(uint *)&req->field_0xd9 & 0xfff7ffff | 0x80000;
    }
    else {
      Curl_bufq_reset(&req->sendbuf);
      if ((ulong)(data->set).upload_buffer_size != (req->sendbuf).chunk_size) {
        Curl_bufq_free(&req->sendbuf);
        Curl_bufq_init2(&req->sendbuf,(ulong)(data->set).upload_buffer_size,1,1);
      }
    }
    req_local._4_4_ = CURLE_OK;
  }
  return req_local._4_4_;
}

Assistant:

CURLcode Curl_req_soft_reset(struct SingleRequest *req,
                             struct Curl_easy *data)
{
  CURLcode result;

  req->done = FALSE;
  req->upload_done = FALSE;
  req->upload_aborted = FALSE;
  req->download_done = FALSE;
  req->eos_written = FALSE;
  req->eos_read = FALSE;
  req->eos_sent = FALSE;
  req->ignorebody = FALSE;
  req->shutdown = FALSE;
  req->bytecount = 0;
  req->writebytecount = 0;
  req->header = TRUE; /* assume header */
  req->headerline = 0;
  req->headerbytecount = 0;
  req->allheadercount =  0;
  req->deductheadercount = 0;

  result = Curl_client_start(data);
  if(result)
    return result;

  if(!req->sendbuf_init) {
    Curl_bufq_init2(&req->sendbuf, data->set.upload_buffer_size, 1,
                    BUFQ_OPT_SOFT_LIMIT);
    req->sendbuf_init = TRUE;
  }
  else {
    Curl_bufq_reset(&req->sendbuf);
    if(data->set.upload_buffer_size != req->sendbuf.chunk_size) {
      Curl_bufq_free(&req->sendbuf);
      Curl_bufq_init2(&req->sendbuf, data->set.upload_buffer_size, 1,
                      BUFQ_OPT_SOFT_LIMIT);
    }
  }

  return CURLE_OK;
}